

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.h
# Opt level: O0

void tcmalloc::SymbolizerAPI::With
               (FunctionRef<void_(const_tcmalloc::SymbolizerAPI_&)> body,
               FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)> callback)

{
  SymbolizerAPI local_38;
  undefined1 local_28 [8];
  FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)> callback_local;
  FunctionRef<void_(const_tcmalloc::SymbolizerAPI_&)> body_local;
  
  callback_local.fn = (_func_void_SymbolizeOutcome_ptr_void_ptr *)callback.data;
  local_28 = (undefined1  [8])callback.fn;
  callback_local.data = body.fn;
  SymbolizerAPI(&local_38,(FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)> *)local_28);
  FunctionRef<void_(const_tcmalloc::SymbolizerAPI_&)>::operator()
            ((FunctionRef<void_(const_tcmalloc::SymbolizerAPI_&)> *)&callback_local.data,&local_38);
  ~SymbolizerAPI(&local_38);
  return;
}

Assistant:

static void With(FunctionRef<void(const SymbolizerAPI& api)> body,
                   FunctionRef<void(const SymbolizeOutcome&)> callback) {
    body(SymbolizerAPI{&callback});
  }